

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O3

longdouble * __thiscall
fire::optional<long_double>::value(longdouble *__return_storage_ptr__,optional<long_double> *this)

{
  char cVar1;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  longdouble *plVar2;
  ostream *poVar3;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  cVar1 = *(char *)(__return_storage_ptr__ + 1);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"accessing unassigned optional","");
  if (cVar1 != '\0') {
    plVar2 = extraout_RAX;
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
      plVar2 = extraout_RAX_00;
    }
    return plVar2;
  }
  if (local_30 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," (programmer side)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_38,local_30);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  exit(1);
}

Assistant:

T value() const { _instant_assert(_exists, "accessing unassigned optional"); return _value; }